

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fVertexArrayTest.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Functional::SingleVertexArrayOffsetGroup::init
          (SingleVertexArrayOffsetGroup *this,EVP_PKEY_CTX *ctx)

{
  pointer *ppAVar1;
  InputType type;
  GLValue max_;
  int iVar2;
  int iVar3;
  long *plVar4;
  undefined8 *puVar5;
  MultiVertexArrayTest *this_00;
  int iVar6;
  long *plVar7;
  ulong *puVar8;
  int **ppiVar9;
  long lVar10;
  ulong uVar11;
  int *piVar12;
  undefined8 uVar13;
  InputType IVar14;
  bool bVar15;
  GLValue GVar16;
  Spec spec;
  string name;
  ArraySpec arraySpec;
  undefined1 local_188 [16];
  pointer local_178;
  pointer pAStack_170;
  pointer local_168;
  long *local_160;
  undefined8 local_158;
  long local_150;
  undefined8 uStack_148;
  long local_140;
  long local_138;
  ulong *local_130;
  long local_128;
  ulong local_120;
  long lStack_118;
  string local_110;
  string local_f0;
  undefined1 local_d0 [16];
  int *local_c0;
  long lStack_b8;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  InputType local_50;
  undefined4 uStack_4c;
  anon_union_8_10_1f5805e9_for_GLValue_1 aStack_48;
  InputType local_40;
  undefined4 uStack_3c;
  anon_union_8_10_1f5805e9_for_GLValue_1 aStack_38;
  
  local_140 = 0;
  do {
    local_138 = 0;
    do {
      lVar10 = 0;
      do {
        IVar14 = this->m_type & ~INPUTTYPE_FIXED;
        if (lVar10 == 0) {
          iVar2 = deqp::gls::Array::inputTypeSize(this->m_type);
          iVar2 = iVar2 << (IVar14 == INPUTTYPE_UNSIGNED_INT_2_10_10_10) + 1;
        }
        else {
          iVar2 = *(int *)((long)&DAT_01c36a20 + lVar10);
        }
        iVar3 = deqp::gls::Array::inputTypeSize(this->m_type);
        iVar6 = iVar3 * 4;
        if (IVar14 != INPUTTYPE_UNSIGNED_INT_2_10_10_10) {
          iVar6 = iVar3;
        }
        if (iVar2 % iVar6 == 0) {
          bVar15 = *(int *)(&DAT_01c05fa0 + local_140 * 4) % iVar6 == 0;
        }
        else {
          bVar15 = false;
        }
        iVar6 = *(int *)(&DAT_01c05fa0 + local_140 * 4);
        typeToString<int>(&local_70,iVar6);
        plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x1c8d8e2);
        plVar7 = plVar4 + 2;
        if ((long *)*plVar4 == plVar7) {
          local_80 = *plVar7;
          lStack_78 = plVar4[3];
          local_90 = &local_80;
        }
        else {
          local_80 = *plVar7;
          local_90 = (long *)*plVar4;
        }
        local_88 = plVar4[1];
        *plVar4 = (long)plVar7;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
        local_130 = &local_120;
        puVar8 = (ulong *)(plVar4 + 2);
        if ((ulong *)*plVar4 == puVar8) {
          local_120 = *puVar8;
          lStack_118 = plVar4[3];
        }
        else {
          local_120 = *puVar8;
          local_130 = (ulong *)*plVar4;
        }
        local_128 = plVar4[1];
        *plVar4 = (long)puVar8;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        typeToString<int>(&local_f0,iVar2);
        uVar11 = 0xf;
        if (local_130 != &local_120) {
          uVar11 = local_120;
        }
        if (uVar11 < local_f0._M_string_length + local_128) {
          uVar13 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            uVar13 = local_f0.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar13 < local_f0._M_string_length + local_128) goto LAB_0119078b;
          puVar5 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_130);
        }
        else {
LAB_0119078b:
          puVar5 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_130,(ulong)local_f0._M_dataplus._M_p);
        }
        local_188._0_8_ = &local_178;
        ppAVar1 = (pointer *)(puVar5 + 2);
        if ((pointer *)*puVar5 == ppAVar1) {
          local_178 = *ppAVar1;
          pAStack_170 = (pointer)puVar5[3];
        }
        else {
          local_178 = *ppAVar1;
          local_188._0_8_ = (pointer *)*puVar5;
        }
        local_188._8_8_ = puVar5[1];
        *puVar5 = ppAVar1;
        puVar5[1] = 0;
        *(undefined1 *)ppAVar1 = 0;
        plVar4 = (long *)std::__cxx11::string::append(local_188);
        local_d0._0_8_ = &local_c0;
        ppiVar9 = (int **)(plVar4 + 2);
        if ((int **)*plVar4 == ppiVar9) {
          local_c0 = *ppiVar9;
          lStack_b8 = plVar4[3];
        }
        else {
          local_c0 = *ppiVar9;
          local_d0._0_8_ = (int **)*plVar4;
        }
        local_d0._8_8_ = plVar4[1];
        *plVar4 = (long)ppiVar9;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        iVar3 = (&DAT_01c06180)[local_138];
        typeToString<int>(&local_110,iVar3);
        piVar12 = (int *)0xf;
        if ((int **)local_d0._0_8_ != &local_c0) {
          piVar12 = local_c0;
        }
        if (piVar12 < (int *)(local_110._M_string_length + local_d0._8_8_)) {
          uVar13 = (int *)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != &local_110.field_2) {
            uVar13 = local_110.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar13 < (int *)(local_110._M_string_length + local_d0._8_8_))
          goto LAB_011908e8;
          puVar5 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,local_d0._0_8_);
        }
        else {
LAB_011908e8:
          puVar5 = (undefined8 *)
                   std::__cxx11::string::_M_append(local_d0,(ulong)local_110._M_dataplus._M_p);
        }
        local_160 = &local_150;
        plVar4 = puVar5 + 2;
        if ((long *)*puVar5 == plVar4) {
          local_150 = *plVar4;
          uStack_148 = puVar5[3];
        }
        else {
          local_150 = *plVar4;
          local_160 = (long *)*puVar5;
        }
        local_158 = puVar5[1];
        *puVar5 = plVar4;
        puVar5[1] = 0;
        *(undefined1 *)plVar4 = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
        }
        if ((int **)local_d0._0_8_ != &local_c0) {
          operator_delete((void *)local_d0._0_8_,(long)local_c0 + 1);
        }
        if ((pointer *)local_188._0_8_ != &local_178) {
          operator_delete((void *)local_188._0_8_,(ulong)((long)&local_178->inputType + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
        }
        if (local_130 != &local_120) {
          operator_delete(local_130,local_120 + 1);
        }
        if (local_90 != &local_80) {
          operator_delete(local_90,local_80 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        type = this->m_type;
        GVar16 = deqp::gls::GLValue::getMinValue(type);
        aStack_38 = GVar16.field_1;
        local_40 = GVar16.type;
        GVar16 = deqp::gls::GLValue::getMaxValue(this->m_type);
        aStack_48 = GVar16.field_1;
        local_50 = GVar16.type;
        max_._4_4_ = uStack_4c;
        max_.type = local_50;
        GVar16._4_4_ = uStack_3c;
        GVar16.type = local_40;
        GVar16.field_1 = aStack_38;
        max_.field_1 = aStack_48;
        deqp::gls::MultiVertexArrayTest::Spec::ArraySpec::ArraySpec
                  ((ArraySpec *)local_d0,type,OUTPUTTYPE_VEC2,STORAGE_BUFFER,USAGE_DYNAMIC_DRAW,
                   (uint)(IVar14 == INPUTTYPE_UNSIGNED_INT_2_10_10_10) * 2 + 2,iVar6,iVar2,false,
                   GVar16,max_);
        local_178 = (pointer)0x0;
        pAStack_170 = (pointer)0x0;
        local_168 = (pointer)0x0;
        local_188._4_4_ = iVar3;
        local_188._0_4_ = PRIMITIVE_TRIANGLES;
        local_188._8_8_ = local_188._8_8_ & 0xffffffff00000000;
        std::
        vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>>
        ::_M_realloc_insert<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec_const&>
                  ((vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>>
                    *)&local_178,(iterator)0x0,(ArraySpec *)local_d0);
        if (bVar15) {
          this_00 = (MultiVertexArrayTest *)operator_new(0xe0);
          deqp::gls::MultiVertexArrayTest::MultiVertexArrayTest
                    (this_00,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.
                             m_testCtx,((this->super_TestCaseGroup).m_context)->m_renderCtx,
                     (Spec *)local_188,(char *)local_160,(char *)local_160);
          tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
        }
        if (local_178 != (pointer)0x0) {
          operator_delete(local_178,(long)local_168 - (long)local_178);
        }
        if (local_160 != &local_150) {
          operator_delete(local_160,local_150 + 1);
        }
        lVar10 = lVar10 + 4;
      } while (lVar10 != 0xc);
      bVar15 = local_138 == 0;
      local_138 = local_138 + 1;
    } while (bVar15);
    local_140 = local_140 + 1;
    if (local_140 == 4) {
      return 4;
    }
  } while( true );
}

Assistant:

void SingleVertexArrayOffsetGroup::init (void)
{
	int					counts[]		= {1, 256};
	int					offsets[]		= {1, 4, 17, 32};
	int					strides[]		= {/*0,*/ -1, 17, 32}; // Tread negative value as sizeof input. Same as 0, but done outside of GL.

	for (int offsetNdx = 0; offsetNdx < DE_LENGTH_OF_ARRAY(offsets); offsetNdx++)
	{
		for (int countNdx = 0; countNdx < DE_LENGTH_OF_ARRAY(counts); countNdx++)
		{
			for (int strideNdx = 0; strideNdx < DE_LENGTH_OF_ARRAY(strides); strideNdx++)
			{
				const bool			packed			= m_type == Array::INPUTTYPE_UNSIGNED_INT_2_10_10_10 || m_type == Array::INPUTTYPE_INT_2_10_10_10;
				const int			componentCount	= (packed) ? (4) : (2);
				const int			stride			= (strides[strideNdx] < 0 ? Array::inputTypeSize(m_type) * componentCount : strides[strideNdx]);
				const int			alignment		= (packed) ? (Array::inputTypeSize(m_type) * componentCount) : (Array::inputTypeSize(m_type));
				const bool			aligned			= ((stride % alignment) == 0) && ((offsets[offsetNdx] % alignment) == 0);
				const std::string	name			= "offset" + typeToString(offsets[offsetNdx]) + "_stride" + typeToString(stride) + "_quads" + typeToString(counts[countNdx]);

				MultiVertexArrayTest::Spec::ArraySpec arraySpec(m_type,
																Array::OUTPUTTYPE_VEC2,
																Array::STORAGE_BUFFER,
																Array::USAGE_DYNAMIC_DRAW,
																componentCount,
																offsets[offsetNdx],
																stride,
																false,
																GLValue::getMinValue(m_type),
																GLValue::getMaxValue(m_type));

				MultiVertexArrayTest::Spec spec;
				spec.primitive	= Array::PRIMITIVE_TRIANGLES;
				spec.drawCount	= counts[countNdx];
				spec.first		= 0;
				spec.arrays.push_back(arraySpec);

				if (aligned)
					addChild(new MultiVertexArrayTest(m_testCtx, m_context.getRenderContext(), spec, name.c_str(), name.c_str()));
			}
		}
	}
}